

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O3

RegexMatcher * __thiscall icu_63::RegexMatcher::reset(RegexMatcher *this)

{
  int64_t iVar1;
  
  this->fRegionStart = 0;
  iVar1 = this->fInputLength;
  this->fRegionLimit = iVar1;
  this->fActiveStart = 0;
  this->fActiveLimit = iVar1;
  this->fAnchorStart = 0;
  this->fAnchorLimit = iVar1;
  this->fLookStart = 0;
  this->fLookLimit = iVar1;
  this->fMatchStart = 0;
  this->fMatchEnd = 0;
  this->fLastMatchEnd = -1;
  this->fAppendPosition = 0;
  this->fMatch = '\0';
  this->fHitEnd = '\0';
  this->fRequireEnd = '\0';
  this->fTime = 0;
  this->fTickCounter = 10000;
  return this;
}

Assistant:

RegexMatcher &RegexMatcher::reset() {
    fRegionStart    = 0;
    fRegionLimit    = fInputLength;
    fActiveStart    = 0;
    fActiveLimit    = fInputLength;
    fAnchorStart    = 0;
    fAnchorLimit    = fInputLength;
    fLookStart      = 0;
    fLookLimit      = fInputLength;
    resetPreserveRegion();
    return *this;
}